

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall Assimp::ASEImporter::BuildLights(ASEImporter *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  aiLight **ppaVar6;
  aiLight *this_00;
  aiColor3D *o;
  float local_5c;
  aiColor3D local_40;
  aiVector3t<float> local_34;
  reference local_28;
  Light *in;
  aiLight *out;
  ASEImporter *pAStack_10;
  uint i;
  ASEImporter *this_local;
  
  pAStack_10 = this;
  bVar3 = std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::empty
                    (&this->mParser->m_vLights);
  if (!bVar3) {
    sVar4 = std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::size
                      (&this->mParser->m_vLights);
    this->pcScene->mNumLights = (uint)sVar4;
    auVar2 = ZEXT416(this->pcScene->mNumLights) * ZEXT816(8);
    uVar5 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppaVar6 = (aiLight **)operator_new__(uVar5);
    this->pcScene->mLights = ppaVar6;
    for (out._4_4_ = 0; out._4_4_ < this->pcScene->mNumLights; out._4_4_ = out._4_4_ + 1) {
      this_00 = (aiLight *)operator_new(0x46c);
      aiLight::aiLight(this_00);
      this->pcScene->mLights[out._4_4_] = this_00;
      in = (Light *)this_00;
      local_28 = std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::operator[]
                           (&this->mParser->m_vLights,(ulong)out._4_4_);
      aiVector3t<float>::aiVector3t(&local_34,0.0,0.0,-1.0);
      *(float *)((long)&in[2].super_BaseNode.mTargetAnim.akeyScaling.
                        super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                        super__Vector_impl_data._M_start + 4) = local_34.z;
      *(undefined8 *)
       ((long)&in[2].super_BaseNode.mTargetAnim.akeyPositions.
               super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = local_34._0_8_;
      aiString::Set((aiString *)in,&(local_28->super_BaseNode).mName);
      iVar1 = *(int *)&(local_28->super_BaseNode).field_0x154;
      if (iVar1 == 1) {
        *(undefined4 *)
         ((long)&in[2].super_BaseNode.mTargetAnim.akeyPositions.
                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 3;
        *(float *)&in[3].super_BaseNode.mName.field_0x4 = local_28->mAngle * 0.017453292;
        if ((local_28->mFalloff != 0.0) || (NAN(local_28->mFalloff))) {
          local_5c = local_28->mFalloff * 0.017453292;
        }
        else {
          local_5c = *(float *)&in[3].super_BaseNode.mName.field_0x4;
        }
        *(float *)&in[3].super_BaseNode.mName._M_string_length = local_5c;
      }
      else if (iVar1 == 3) {
        *(undefined4 *)
         ((long)&in[2].super_BaseNode.mTargetAnim.akeyPositions.
                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 1;
      }
      else {
        *(undefined4 *)
         ((long)&in[2].super_BaseNode.mTargetAnim.akeyPositions.
                 super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 2;
      }
      aiColor3D::operator*(&local_40,local_28->mIntensity);
      o = aiColor3D::operator=((aiColor3D *)&in[2].mIntensity,&local_40);
      aiColor3D::operator=(&in[2].mColor,o);
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildLights()
{
    if (!mParser->m_vLights.empty())    {
        pcScene->mNumLights = (unsigned int)mParser->m_vLights.size();
        pcScene->mLights    = new aiLight*[pcScene->mNumLights];

        for (unsigned int i = 0; i < pcScene->mNumLights;++i)   {
            aiLight* out = pcScene->mLights[i] = new aiLight();
            ASE::Light& in = mParser->m_vLights[i];

            // The direction is encoded in the transformation matrix of the node.
            // In 3DS MAX the light source points into negative Z direction if
            // the node transformation is the identity.
            out->mDirection = aiVector3D(0.f,0.f,-1.f);

            out->mName.Set(in.mName);
            switch (in.mLightType)
            {
            case ASE::Light::TARGET:
                out->mType = aiLightSource_SPOT;
                out->mAngleInnerCone = AI_DEG_TO_RAD(in.mAngle);
                out->mAngleOuterCone = (in.mFalloff ? AI_DEG_TO_RAD(in.mFalloff) : out->mAngleInnerCone);
                break;

            case ASE::Light::DIRECTIONAL:
                out->mType = aiLightSource_DIRECTIONAL;
                break;

            default:
            //case ASE::Light::OMNI:
                out->mType = aiLightSource_POINT;
                break;
            };
            out->mColorDiffuse = out->mColorSpecular = in.mColor * in.mIntensity;
        }
    }
}